

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O0

vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall helics::InterfaceInfo::checkInterfacesForIssues_abi_cxx11_(InterfaceInfo *this)

{
  string_view type2;
  string_view type1;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  bool bVar1;
  pointer pIVar2;
  pointer pIVar3;
  reference psVar4;
  pointer pIVar5;
  pointer pPVar6;
  size_type sVar7;
  const_iterator this_00;
  const_iterator __rhs;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *ept;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  handle *__range1_2;
  handle ehandle;
  unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *pub;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  handle *__range1_1;
  handle phandle;
  sourceInformation *source;
  iterator __end2;
  iterator __begin2;
  vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
  *__range2;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *ipt;
  const_iterator __end1;
  const_iterator __begin1;
  handle *__range1;
  handle ihandle;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *issues;
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  *in_stack_fffffffffffff818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff828;
  int32_t *in_stack_fffffffffffff830;
  __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
  local_730;
  undefined1 *local_728;
  undefined1 local_720 [15];
  undefined1 in_stack_fffffffffffff8ef;
  string *in_stack_fffffffffffff8f0;
  string *in_stack_fffffffffffff8f8;
  undefined1 local_6f0 [36];
  undefined4 local_6cc;
  char *local_6c8;
  undefined8 local_6c0;
  undefined1 local_6b8 [23];
  undefined1 in_stack_fffffffffffff95f;
  undefined1 in_stack_fffffffffffff960 [12];
  undefined4 in_stack_fffffffffffff96c;
  size_t in_stack_fffffffffffff970;
  char *pcVar8;
  char *in_stack_fffffffffffff978;
  undefined8 uVar9;
  undefined1 local_680 [36];
  undefined4 local_65c;
  reference local_658;
  unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *local_650;
  __normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
  local_648;
  undefined1 *local_640;
  undefined1 local_638 [24];
  char *local_620;
  undefined8 local_618;
  undefined1 local_610 [36];
  undefined4 local_5ec;
  char *local_5e8;
  undefined8 local_5e0;
  undefined1 local_5d8 [36];
  undefined4 local_5b4;
  __sv_type in_stack_fffffffffffffa50;
  iterator in_stack_fffffffffffffa80;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffa88;
  char *in_stack_fffffffffffffa90;
  char *in_stack_fffffffffffffa98;
  undefined1 local_550 [36];
  undefined4 local_52c;
  char *local_528;
  undefined8 local_520;
  undefined1 local_518 [36];
  undefined4 local_4f4;
  char *local_4f0;
  undefined8 local_4e8;
  undefined1 local_4e0 [36];
  undefined4 local_4bc;
  reference local_4b8;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *local_4b0;
  __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
  local_4a8;
  undefined1 *local_4a0;
  undefined1 local_488 [31];
  byte local_469;
  undefined1 local_458 [16];
  undefined8 local_448;
  undefined1 *local_440;
  char *local_438;
  undefined8 uStack_430;
  string *local_428;
  char *local_420;
  undefined8 uStack_418;
  undefined1 *local_410;
  undefined1 local_408 [16];
  undefined8 local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  undefined8 uStack_3e0;
  string *local_3d8;
  char *local_3d0;
  undefined8 uStack_3c8;
  undefined1 *local_3c0;
  undefined1 local_3b8 [16];
  undefined8 local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  undefined8 uStack_390;
  string *local_388;
  char *local_380;
  undefined8 uStack_378;
  undefined1 *local_370;
  undefined1 local_368 [16];
  undefined8 local_358;
  undefined1 *local_350;
  char *local_348;
  undefined8 uStack_340;
  string *local_338;
  char *local_330;
  undefined8 uStack_328;
  undefined1 *local_320;
  undefined1 local_318 [16];
  int32_t local_308 [4];
  undefined8 local_2f8 [2];
  undefined8 local_2e8 [2];
  undefined8 local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b0;
  undefined8 *local_2a8;
  int32_t *local_2a0;
  string *local_298;
  char *local_290;
  undefined8 uStack_288;
  undefined1 *local_280;
  undefined1 local_278 [48];
  undefined8 local_248;
  undefined1 *local_240;
  char *local_238;
  undefined8 uStack_230;
  string *local_228;
  string *local_220;
  string *local_218;
  char *local_210;
  undefined8 uStack_208;
  undefined1 *local_200;
  undefined1 local_1f8 [48];
  undefined8 local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  undefined8 uStack_1b0;
  string *local_1a8;
  string *local_1a0;
  string *local_198;
  char *local_190;
  undefined8 uStack_188;
  undefined1 *local_180;
  undefined1 local_178 [16];
  int32_t local_168 [4];
  undefined8 local_158 [2];
  undefined8 local_148;
  undefined1 *local_140;
  char *local_138;
  undefined8 uStack_130;
  undefined8 *local_120;
  int32_t *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  char *local_108;
  undefined8 uStack_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined8 *local_e8;
  undefined1 *local_e0;
  undefined8 *local_d8;
  undefined1 *local_d0;
  undefined8 *local_c8;
  undefined1 *local_c0;
  undefined8 *local_b8;
  int32_t local_ac;
  int32_t *local_a8;
  int32_t local_9c;
  int32_t *local_98;
  undefined8 local_90;
  undefined8 *local_88;
  undefined8 local_80;
  undefined8 *local_78;
  undefined8 local_70;
  undefined8 *local_68;
  undefined1 *local_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 *local_38;
  undefined1 *local_30;
  undefined8 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_469 = 0;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x4eff07);
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock((shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
          *)in_stack_fffffffffffff818);
  local_4a0 = local_488;
  local_4a8._M_current =
       (unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
       gmlc::libguarded::
       lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
       ::begin((lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                *)in_stack_fffffffffffff818);
  local_4b0 = (unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
              gmlc::libguarded::
              lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
              ::end((lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                     *)in_stack_fffffffffffff818);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                           ((__normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                             *)in_stack_fffffffffffff820,
                            (__normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                             *)in_stack_fffffffffffff818), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_4b8 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                ::operator*(&local_4a8);
    pIVar2 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::operator->
                       ((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
                        0x4effc5);
    if (((pIVar2->required & 1U) != 0) &&
       (pIVar2 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
                 operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                             *)0x4effdc), (pIVar2->has_target & 1U) == 0)) {
      local_4bc = 0xfffffffe;
      local_4f0 = "Input {} is required but has no connection";
      local_4e8 = 0x2a;
      pIVar2 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
               operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
                          0x4f0019);
      local_338 = &pIVar2->key;
      local_320 = local_4e0;
      local_330 = local_4f0;
      uStack_328 = local_4e8;
      local_348 = local_4f0;
      uStack_340 = local_4e8;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                ((value<fmt::v11::context> *)in_stack_fffffffffffff830,in_stack_fffffffffffff828);
      local_e8 = &local_358;
      local_f0 = local_368;
      local_358 = 0xd;
      fmt.size_ = (size_t)in_stack_fffffffffffffa98;
      fmt.data_ = in_stack_fffffffffffffa90;
      args.field_1.values_ = in_stack_fffffffffffffa88.values_;
      args.desc_ = (unsigned_long_long)in_stack_fffffffffffffa80._M_current;
      local_350 = local_f0;
      ::fmt::v11::vformat_abi_cxx11_(fmt,args);
      std::
      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
      ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff830,(Errors *)in_stack_fffffffffffff828,
                 in_stack_fffffffffffff820);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff820);
    }
    pIVar2 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::operator->
                       ((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
                        0x4f017d);
    if (0 < pIVar2->required_connnections) {
      pIVar2 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
               operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
                          0x4f0194);
      sVar7 = std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::size
                        (&pIVar2->input_sources);
      pIVar2 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
               operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
                          0x4f01b5);
      if (sVar7 != (long)pIVar2->required_connnections) {
        pIVar2 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
                 operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                             *)0x4f01d7);
        if (pIVar2->required_connnections == 1) {
          local_4f4 = 0xfffffffe;
          local_528 = "Input {} is single source only but has more than one connection";
          local_520 = 0x3f;
          pIVar2 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
                   operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                               *)0x4f0214);
          local_388 = &pIVar2->key;
          local_370 = local_518;
          local_380 = local_528;
          uStack_378 = local_520;
          local_398 = local_528;
          uStack_390 = local_520;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff830,in_stack_fffffffffffff828
                    );
          local_d8 = &local_3a8;
          local_e0 = local_3b8;
          local_3a8 = 0xd;
          fmt_00.size_ = (size_t)in_stack_fffffffffffffa98;
          fmt_00.data_ = in_stack_fffffffffffffa90;
          args_00.field_1.values_ = in_stack_fffffffffffffa88.values_;
          args_00.desc_ = (unsigned_long_long)in_stack_fffffffffffffa80._M_current;
          local_3a0 = local_e0;
          ::fmt::v11::vformat_abi_cxx11_(fmt_00,args_00);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffff830,(Errors *)in_stack_fffffffffffff828,
                     in_stack_fffffffffffff820);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff820);
        }
        else {
          local_52c = 0xfffffffe;
          pIVar2 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
                   operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                               *)0x4f036d);
          pIVar5 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
                   operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                               *)0x4f0383);
          pIVar3 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
                   operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                               *)0x4f0399);
          sVar7 = std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::size
                            (&pIVar3->input_sources);
          pIVar3 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
                   operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                               *)0x4f03ba);
          in_stack_fffffffffffffa98 = "";
          if (sVar7 < (ulong)(long)pIVar3->required_connnections) {
            in_stack_fffffffffffffa98 = " only";
          }
          pIVar3 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
                   operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                               *)0x4f03f0);
          in_stack_fffffffffffffa90 =
               (char *)std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::
                       size(&pIVar3->input_sources);
          local_280 = local_550;
          local_290 = "Input {} requires {} connections but{} {} were made";
          uStack_288 = 0x33;
          local_2a8 = (undefined8 *)&stack0xfffffffffffffa98;
          local_2b0 = (undefined8 *)&stack0xfffffffffffffa90;
          local_2c8 = "Input {} requires {} connections but{} {} were made";
          uStack_2c0 = 0x33;
          local_2a0 = &pIVar5->required_connnections;
          local_298 = &pIVar2->key;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff830,in_stack_fffffffffffff828
                    );
          local_98 = local_308;
          local_9c = *local_2a0;
          local_88 = local_2f8;
          local_90 = *local_2a8;
          local_68 = local_2e8;
          local_70 = *local_2b0;
          local_58 = &local_2d8;
          local_60 = local_318;
          local_2d8 = 0x4c1d;
          fmt_01.size_ = (size_t)in_stack_fffffffffffffa98;
          fmt_01.data_ = in_stack_fffffffffffffa90;
          args_01.field_1.values_ = in_stack_fffffffffffffa88.values_;
          args_01.desc_ = (unsigned_long_long)in_stack_fffffffffffffa80._M_current;
          local_50 = local_70;
          local_48 = local_68;
          local_308[0] = local_9c;
          local_2f8[0] = local_90;
          local_2e8[0] = local_70;
          local_2d0 = local_60;
          ::fmt::v11::vformat_abi_cxx11_(fmt_01,args_01);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffff830,(Errors *)in_stack_fffffffffffff828,
                     in_stack_fffffffffffff820);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff820);
        }
      }
    }
    pIVar2 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::operator->
                       ((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
                        0x4f0636);
    in_stack_fffffffffffffa88.values_ = (value<fmt::v11::context> *)&pIVar2->source_info;
    in_stack_fffffffffffffa80 =
         std::
         vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
         ::begin((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                  *)in_stack_fffffffffffff818);
    std::
    vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
    ::end((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
           *)in_stack_fffffffffffff818);
    while (bVar1 = __gnu_cxx::
                   operator==<helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
                             ((__normal_iterator<helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
                               *)in_stack_fffffffffffff820,
                              (__normal_iterator<helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
                               *)in_stack_fffffffffffff818), ((bVar1 ^ 0xffU) & 1) != 0) {
      psVar4 = __gnu_cxx::
               __normal_iterator<helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
               ::operator*((__normal_iterator<helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
                            *)&stack0xfffffffffffffa80);
      std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::operator->
                ((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)0x4f06b0)
      ;
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff820);
      in_stack_fffffffffffffa50 =
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffff820);
      std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::operator->
                ((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)0x4f06fa)
      ;
      type1._M_str = in_stack_fffffffffffff978;
      type1._M_len = in_stack_fffffffffffff970;
      type2._M_str._4_4_ = in_stack_fffffffffffff96c;
      type2._0_12_ = in_stack_fffffffffffff960;
      bVar1 = checkTypeMatch(type1,type2,(bool)in_stack_fffffffffffff95f);
      if (!bVar1) {
        local_5b4 = 0xfffffffe;
        local_5e8 = "Input \"{}\" source has mismatched types: {} is not compatible with {}";
        local_5e0 = 0x44;
        pIVar2 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
                 operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                             *)0x4f076f);
        pIVar5 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
                 operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                             *)0x4f0785);
        local_220 = &pIVar5->type;
        local_228 = &psVar4->type;
        local_200 = local_5d8;
        local_210 = local_5e8;
        uStack_208 = local_5e0;
        local_238 = local_5e8;
        uStack_230 = local_5e0;
        local_218 = &pIVar2->key;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffff830,in_stack_fffffffffffff828);
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffff830,in_stack_fffffffffffff828);
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffff830,in_stack_fffffffffffff828);
        local_18 = &local_248;
        local_20 = local_278;
        local_248 = 0xddd;
        fmt_02.size_ = (size_t)in_stack_fffffffffffffa98;
        fmt_02.data_ = in_stack_fffffffffffffa90;
        args_02.field_1.values_ = in_stack_fffffffffffffa88.values_;
        args_02.desc_ = (unsigned_long_long)in_stack_fffffffffffffa80._M_current;
        local_240 = local_20;
        ::fmt::v11::vformat_abi_cxx11_(fmt_02,args_02);
        std::
        vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
        ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                  ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff830,(Errors *)in_stack_fffffffffffff828,
                   in_stack_fffffffffffff820);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff820);
      }
      pIVar2 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
               operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
                          0x4f0907);
      if ((pIVar2->ignore_unit_mismatch & 1U) == 0) {
        std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::operator->
                  ((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
                   0x4f091e);
        bVar1 = checkUnitMatch(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
                               (bool)in_stack_fffffffffffff8ef);
        if (!bVar1) {
          local_5ec = 0xfffffffe;
          local_620 = "Input \"{}\" source has incompatible unit: {} is not convertible to {}";
          local_618 = 0x44;
          pIVar2 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
                   operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                               *)0x4f097f);
          pIVar5 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
                   operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                               *)0x4f09a6);
          local_1a8 = &pIVar5->units;
          local_180 = local_610;
          local_190 = local_620;
          uStack_188 = local_618;
          local_1b8 = local_620;
          uStack_1b0 = local_618;
          local_1a0 = &psVar4->units;
          local_198 = &pIVar2->key;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff830,in_stack_fffffffffffff828
                    );
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff830,in_stack_fffffffffffff828
                    );
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff830,in_stack_fffffffffffff828
                    );
          local_28 = &local_1c8;
          local_30 = local_1f8;
          local_1c8 = 0xddd;
          fmt_03.size_ = (size_t)in_stack_fffffffffffffa98;
          fmt_03.data_ = in_stack_fffffffffffffa90;
          args_03.field_1.values_ = in_stack_fffffffffffffa88.values_;
          args_03.desc_ = (unsigned_long_long)in_stack_fffffffffffffa80._M_current;
          local_1c0 = local_30;
          ::fmt::v11::vformat_abi_cxx11_(fmt_03,args_03);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffff830,(Errors *)in_stack_fffffffffffff828,
                     in_stack_fffffffffffff820);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff820);
        }
      }
      __gnu_cxx::
      __normal_iterator<helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
      ::operator++((__normal_iterator<helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
                    *)&stack0xfffffffffffffa80);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
    ::operator++(&local_4a8);
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::unlock((lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
            *)in_stack_fffffffffffff820);
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock((shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
          *)in_stack_fffffffffffff818);
  local_640 = local_638;
  local_648._M_current =
       (unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *)
       gmlc::libguarded::
       lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
       ::begin((lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                *)in_stack_fffffffffffff818);
  local_650 = (unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *)
              gmlc::libguarded::
              lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
              ::end((lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                     *)in_stack_fffffffffffff818);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
                           ((__normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
                             *)in_stack_fffffffffffff820,
                            (__normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
                             *)in_stack_fffffffffffff818), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_658 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
                ::operator*(&local_648);
    pPVar6 = std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
             ::operator->((unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                           *)0x4f0bf7);
    if ((pPVar6->required & 1U) != 0) {
      std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>::
      operator->((unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                  *)0x4f0c11);
      bVar1 = std::
              vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
              ::empty((vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                       *)in_stack_fffffffffffff830);
      if (bVar1) {
        local_65c = 0xfffffffe;
        pcVar8 = "Publication {} is required but has no subscribers";
        uVar9 = 0x31;
        pPVar6 = std::
                 unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                 ::operator->((unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                               *)0x4f0c59);
        local_3d8 = &pPVar6->key;
        local_3c0 = local_680;
        local_3e8 = pcVar8;
        uStack_3e0 = uVar9;
        local_3d0 = pcVar8;
        uStack_3c8 = uVar9;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffff830,in_stack_fffffffffffff828);
        local_c8 = &local_3f8;
        local_d0 = local_408;
        local_3f8 = 0xd;
        fmt_04.size_ = (size_t)in_stack_fffffffffffffa98;
        fmt_04.data_ = in_stack_fffffffffffffa90;
        args_04.field_1.values_ = in_stack_fffffffffffffa88.values_;
        args_04.desc_ = (unsigned_long_long)in_stack_fffffffffffffa80._M_current;
        local_3f0 = local_d0;
        ::fmt::v11::vformat_abi_cxx11_(fmt_04,args_04);
        std::
        vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
        ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                  ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff830,(Errors *)in_stack_fffffffffffff828,
                   in_stack_fffffffffffff820);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff820);
      }
    }
    pPVar6 = std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
             ::operator->((unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                           *)0x4f0da4);
    if (0 < pPVar6->requiredConnections) {
      pPVar6 = std::
               unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>::
               operator->((unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                           *)0x4f0dbe);
      sVar7 = std::
              vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
              ::size(&pPVar6->subscribers);
      pPVar6 = std::
               unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>::
               operator->((unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                           *)0x4f0ddc);
      if (sVar7 != (long)pPVar6->requiredConnections) {
        pPVar6 = std::
                 unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                 ::operator->((unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                               *)0x4f0e01);
        if (pPVar6->requiredConnections == 1) {
          local_6c8 = "Publication {} is single source only but has more than one connection";
          local_6c0 = 0x45;
          pPVar6 = std::
                   unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                   ::operator->((unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                                 *)0x4f0e41);
          local_428 = &pPVar6->key;
          local_410 = local_6b8;
          local_420 = local_6c8;
          uStack_418 = local_6c0;
          local_438 = local_6c8;
          uStack_430 = local_6c0;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff830,in_stack_fffffffffffff828
                    );
          local_b8 = &local_448;
          local_c0 = local_458;
          local_448 = 0xd;
          fmt_05.size_ = (size_t)in_stack_fffffffffffffa98;
          fmt_05.data_ = in_stack_fffffffffffffa90;
          args_05.field_1.values_ = in_stack_fffffffffffffa88.values_;
          args_05.desc_ = (unsigned_long_long)in_stack_fffffffffffffa80._M_current;
          local_440 = local_c0;
          ::fmt::v11::vformat_abi_cxx11_(fmt_05,args_05);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffff830,(Errors *)in_stack_fffffffffffff828,
                     in_stack_fffffffffffff820);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff820);
        }
        else {
          local_6cc = 0xfffffffe;
          pPVar6 = std::
                   unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                   ::operator->((unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                                 *)0x4f0f9a);
          in_stack_fffffffffffff828 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pPVar6->key;
          pPVar6 = std::
                   unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                   ::operator->((unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                                 *)0x4f0fb0);
          in_stack_fffffffffffff830 = &pPVar6->requiredConnections;
          pPVar6 = std::
                   unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                   ::operator->((unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                                 *)0x4f0fc8);
          std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
          ::size(&pPVar6->subscribers);
          local_f8 = local_6f0;
          local_108 = "Publication {} requires {} connections but only {} are made";
          uStack_100 = 0x3b;
          local_120 = (undefined8 *)&stack0xfffffffffffff8f8;
          local_138 = "Publication {} requires {} connections but only {} are made";
          uStack_130 = 0x3b;
          local_118 = in_stack_fffffffffffff830;
          local_110 = in_stack_fffffffffffff828;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff830,in_stack_fffffffffffff828
                    );
          local_a8 = local_168;
          local_ac = *local_118;
          local_78 = local_158;
          local_80 = *local_120;
          local_8 = &local_148;
          local_10 = local_178;
          local_148 = 0x41d;
          fmt_06.size_ = (size_t)in_stack_fffffffffffffa98;
          fmt_06.data_ = in_stack_fffffffffffffa90;
          args_06.field_1.values_ = in_stack_fffffffffffffa88.values_;
          args_06.desc_ = (unsigned_long_long)in_stack_fffffffffffffa80._M_current;
          local_40 = local_80;
          local_38 = local_78;
          local_168[0] = local_ac;
          local_158[0] = local_80;
          local_140 = local_10;
          ::fmt::v11::vformat_abi_cxx11_(fmt_06,args_06);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffff830,(Errors *)in_stack_fffffffffffff828,
                     in_stack_fffffffffffff820);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff820);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
    ::operator++(&local_648);
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::unlock((lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
            *)in_stack_fffffffffffff820);
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock(in_stack_fffffffffffff818);
  local_728 = local_720;
  this_00 = gmlc::libguarded::
            lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
            ::begin((lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                     *)in_stack_fffffffffffff818);
  local_730._M_current =
       (unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)this_00;
  __rhs = gmlc::libguarded::
          lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
          ::end((lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                 *)in_stack_fffffffffffff818);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                           ((__normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                             *)this_00._M_current,
                            (__normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                             *)__rhs._M_current), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
    ::operator*(&local_730);
    std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>::operator->
              ((unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)
               0x4f1284);
    EndpointInfo::checkInterfacesForIssues
              ((EndpointInfo *)in_stack_fffffffffffffa50._M_str,
               (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffa50._M_len);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
    ::operator++(&local_730);
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::unlock((lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
            *)this_00._M_current);
  local_469 = 1;
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                  *)0x4f12ee);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                  *)0x4f12fb);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                  *)0x4f1308);
  if ((local_469 & 1) == 0) {
    std::
    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_stack_fffffffffffff830);
  }
  return in_RDI;
}

Assistant:

std::vector<std::pair<int, std::string>> InterfaceInfo::checkInterfacesForIssues()
{
    std::vector<std::pair<int, std::string>> issues;
    auto ihandle = inputs.lock();
    for (const auto& ipt : ihandle) {
        if (ipt->required) {
            if (!ipt->has_target) {
                issues.emplace_back(helics::defs::Errors::CONNECTION_FAILURE,
                                    fmt::format("Input {} is required but has no connection",
                                                ipt->key));
            }
        }
        if (ipt->required_connnections > 0) {
            if (ipt->input_sources.size() != static_cast<size_t>(ipt->required_connnections)) {
                if (ipt->required_connnections == 1) {
                    issues.emplace_back(
                        helics::defs::Errors::CONNECTION_FAILURE,
                        fmt::format(
                            "Input {} is single source only but has more than one connection",
                            ipt->key));
                } else {
                    issues.emplace_back(
                        helics::defs::Errors::CONNECTION_FAILURE,
                        fmt::format("Input {} requires {} connections but{} {} were made",
                                    ipt->key,
                                    ipt->required_connnections,
                                    (ipt->input_sources.size() <
                                     static_cast<size_t>(ipt->required_connnections)) ?
                                        " only" :
                                        "",
                                    ipt->input_sources.size()));
                }
            }
        }
        for (auto& source : ipt->source_info) {
            if (!checkTypeMatch(ipt->type, source.type, ipt->strict_type_matching)) {
                issues.emplace_back(
                    helics::defs::Errors::CONNECTION_FAILURE,
                    fmt::format(
                        "Input \"{}\" source has mismatched types: {} is not compatible with {}",
                        ipt->key,
                        ipt->type,
                        source.type));
            }
            if ((!ipt->ignore_unit_mismatch) &&
                (!checkUnitMatch(ipt->units, source.units, false))) {
                issues.emplace_back(
                    helics::defs::Errors::CONNECTION_FAILURE,
                    fmt::format(
                        "Input \"{}\" source has incompatible unit: {} is not convertible to {}",
                        ipt->key,
                        source.units,
                        ipt->units));
            }
        }
    }
    ihandle.unlock();
    auto phandle = publications.lock();
    for (const auto& pub : phandle) {
        if (pub->required) {
            if (pub->subscribers.empty()) {
                issues.emplace_back(helics::defs::Errors::CONNECTION_FAILURE,
                                    fmt::format("Publication {} is required but has no subscribers",
                                                pub->key));
            }
        }
        if (pub->requiredConnections > 0) {
            if (pub->subscribers.size() != static_cast<size_t>(pub->requiredConnections)) {
                if (pub->requiredConnections == 1) {
                    issues.emplace_back(
                        helics::defs::Errors::CONNECTION_FAILURE,
                        fmt::format(
                            "Publication {} is single source only but has more than one connection",
                            pub->key));
                } else {
                    issues.emplace_back(
                        helics::defs::Errors::CONNECTION_FAILURE,
                        fmt::format("Publication {} requires {} connections but only {} are made",
                                    pub->key,
                                    pub->requiredConnections,
                                    pub->subscribers.size()));
                }
            }
        }
    }
    phandle.unlock();
    auto ehandle = endpoints.lock();
    for (const auto& ept : ehandle) {
        ept->checkInterfacesForIssues(issues);
    }
    ehandle.unlock();
    return issues;
}